

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-posix.cpp
# Opt level: O0

ssize_t __thiscall
Dashel::SocketStream::send(SocketStream *this,int __fd,void *__buf,size_t __n,int __flags)

{
  _func_int *p_Var1;
  ssize_t sVar2;
  int *piVar3;
  void *extraout_RAX;
  void *extraout_RAX_00;
  undefined4 in_register_00000034;
  ssize_t len;
  size_t left;
  uchar *ptr;
  size_t size_local;
  void *data_local;
  SocketStream *this_local;
  
  left = CONCAT44(in_register_00000034,__fd);
  len = (ssize_t)__buf;
  if ((this->super_DisconnectableStream).super_SelectableStream.fd < 0) {
    __assert_fail("fd >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/aseba-community[P]dashel/dashel/dashel-posix.cpp"
                  ,0x1d7,"void Dashel::SocketStream::send(const void *, size_t)");
  }
  while (len != 0) {
    sVar2 = ::send((this->super_DisconnectableStream).super_SelectableStream.fd,(void *)left,len,
                   0x4000);
    if (sVar2 < 0) {
      p_Var1 = (this->super_DisconnectableStream).super_SelectableStream._vptr_SelectableStream[-3];
      piVar3 = __errno_location();
      Stream::fail((Stream *)
                   ((long)&(this->super_DisconnectableStream).super_SelectableStream.
                           _vptr_SelectableStream + (long)p_Var1),IOError,*piVar3,
                   "Socket write I/O error.");
      __buf = extraout_RAX;
    }
    else if (sVar2 == 0) {
      Stream::fail((Stream *)
                   ((long)&(this->super_DisconnectableStream).super_SelectableStream.
                           _vptr_SelectableStream +
                   (long)(this->super_DisconnectableStream).super_SelectableStream.
                         _vptr_SelectableStream[-3]),ConnectionLost,0,"Connection lost.");
      __buf = extraout_RAX_00;
    }
    else {
      left = sVar2 + left;
      __buf = (void *)(len - sVar2);
      len = (ssize_t)__buf;
    }
  }
  return (ssize_t)__buf;
}

Assistant:

void send(const void* data, size_t size)
		{
			assert(fd >= 0);

			unsigned char* ptr = (unsigned char*)data;
			size_t left = size;

			while (left)
			{
#ifdef MACOSX
				ssize_t len = ::send(fd, ptr, left, 0);
#else
				ssize_t len = ::send(fd, ptr, left, MSG_NOSIGNAL);
#endif

				if (len < 0)
				{
					fail(DashelException::IOError, errno, "Socket write I/O error.");
				}
				else if (len == 0)
				{
					fail(DashelException::ConnectionLost, 0, "Connection lost.");
				}
				else
				{
					ptr += len;
					left -= len;
				}
			}
		}